

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.c
# Opt level: O0

int prf_model_traverse_df(prf_model_t *model,prf_cb_t callback)

{
  prf_node_t *ppVar1;
  prf_state_t *ppVar2;
  prf_nodeinfo_t *ppVar3;
  int *piVar4;
  void *pvVar5;
  prf_state_t *ppVar6;
  undefined8 in_RDX;
  code *in_RSI;
  prf_model_t *in_RDI;
  prf_nodeinfo_t *info_1;
  prf_nodeinfo_t *info;
  prf_state_t *state;
  int traverse;
  int level;
  int *limit;
  int *child;
  prf_node_t **array;
  prf_node_t *node;
  prf_node_t ***stack;
  void *in_stack_ffffffffffffff78;
  prf_state_t *in_stack_ffffffffffffff80;
  int *in_stack_ffffffffffffff88;
  int *in_stack_ffffffffffffff90;
  prf_nodeinfo_t *local_60;
  int local_48;
  int local_44;
  int *local_40;
  prf_state_t *local_38;
  prf_node_t *local_28;
  void *local_20;
  
  ppVar2 = prf_state_create();
  ppVar2->model = in_RDI;
  prf_array_init((int)((ulong)in_stack_ffffffffffffff80 >> 0x20),(int)in_stack_ffffffffffffff80);
  prf_array_init((int)((ulong)in_stack_ffffffffffffff80 >> 0x20),(int)in_stack_ffffffffffffff80);
  prf_array_append_ptr(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  local_20 = prf_array_append_ptr(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  prf_array_init((int)((ulong)in_stack_ffffffffffffff80 >> 0x20),(int)in_stack_ffffffffffffff80);
  local_38 = (prf_state_t *)
             prf_array_append_int
                       (in_stack_ffffffffffffff90,(int)((ulong)in_stack_ffffffffffffff88 >> 0x20));
  prf_array_init((int)((ulong)in_stack_ffffffffffffff80 >> 0x20),(int)in_stack_ffffffffffffff80);
  prf_array_count((void *)0x1070ea);
  local_40 = (int *)prf_array_append_int
                              (in_stack_ffffffffffffff90,
                               (int)((ulong)in_stack_ffffffffffffff88 >> 0x20));
  local_48 = 1;
  local_44 = 0;
  while (*(int *)&local_38->model < *local_40) {
    local_28 = *(prf_node_t **)
                (*(long *)((long)local_20 + (long)local_44 * 8) +
                (long)*(int *)((long)&local_38->model + (long)local_44 * 4) * 8);
    ppVar3 = prf_nodeinfo_get((uint16_t)((ulong)in_stack_ffffffffffffff78 >> 0x30));
    piVar4 = local_40;
    if ((ppVar3 != (prf_nodeinfo_t *)0x0) &&
       (ppVar3->entry_f != (_func_void_prf_node_t_ptr_prf_state_t_ptr *)0x0)) {
      (*ppVar3->entry_f)(local_28,ppVar2);
    }
    while (local_40 = piVar4, local_28->children != (prf_node_t **)0x0) {
      local_20 = prf_array_append_ptr(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      local_38 = (prf_state_t *)
                 prf_array_append_int
                           (in_stack_ffffffffffffff90,
                            (int)((ulong)in_stack_ffffffffffffff88 >> 0x20));
      prf_array_count((void *)0x1071dc);
      piVar4 = (int *)prf_array_append_int(local_40,(int)((ulong)in_stack_ffffffffffffff88 >> 0x20))
      ;
      prf_state_push(in_stack_ffffffffffffff80);
      local_44 = local_44 + 1;
      ppVar2->physical_level = ppVar2->physical_level + 1;
      local_28 = *(prf_node_t **)
                  (*(long *)((long)local_20 + (long)local_44 * 8) +
                  (long)*(int *)((long)&local_38->model + (long)local_44 * 4) * 8);
      ppVar3 = prf_nodeinfo_get((uint16_t)((ulong)in_stack_ffffffffffffff78 >> 0x30));
      in_stack_ffffffffffffff90 = local_40;
      if (ppVar3->entry_f != (_func_void_prf_node_t_ptr_prf_state_t_ptr *)0x0) {
        (*ppVar3->entry_f)(local_28,ppVar2);
        in_stack_ffffffffffffff90 = local_40;
      }
    }
    ppVar2->node = local_28;
    local_48 = (*in_RSI)(ppVar2,in_RDX);
    if (local_48 == 0) break;
    if (local_48 == 3) {
      local_60 = prf_nodeinfo_get((uint16_t)((ulong)in_stack_ffffffffffffff78 >> 0x30));
      do {
        if (local_60->exit_f != (_func_void_prf_node_t_ptr_prf_state_t_ptr *)0x0) {
          (*local_60->exit_f)(*(prf_node_t **)
                               (*(long *)((long)local_20 + (long)local_44 * 8) +
                               (long)*(int *)((long)&local_38->model + (long)local_44 * 4) * 8),
                              ppVar2);
        }
        *(int *)((long)&local_38->model + (long)local_44 * 4) =
             *(int *)((long)&local_38->model + (long)local_44 * 4) + 1;
        local_60 = prf_nodeinfo_get((uint16_t)((ulong)in_stack_ffffffffffffff78 >> 0x30));
        if (local_60->entry_f != (_func_void_prf_node_t_ptr_prf_state_t_ptr *)0x0) {
          (*local_60->entry_f)
                    (*(prf_node_t **)
                      (*(long *)((long)local_20 + (long)local_44 * 8) +
                      (long)*(int *)((long)&local_38->model + (long)local_44 * 4) * 8),ppVar2);
        }
      } while ((local_60->flags & 2) == 0);
    }
    else {
      *(int *)((long)&local_38->model + (long)local_44 * 4) =
           *(int *)((long)&local_38->model + (long)local_44 * 4) + 1;
      if ((0 < local_44) &&
         (local_40[local_44] <= *(int *)((long)&local_38->model + (long)local_44 * 4))) {
        prf_array_count((void *)0x107405);
        pvVar5 = prf_array_set_count(in_stack_ffffffffffffff80,(int)((ulong)local_20 >> 0x20));
        prf_array_count((void *)0x10742c);
        ppVar6 = (prf_state_t *)prf_array_set_count(local_38,(int)((ulong)local_20 >> 0x20));
        prf_array_count((void *)0x107454);
        piVar4 = (int *)prf_array_set_count(local_38,(int)((ulong)local_20 >> 0x20));
        prf_state_pop(local_38);
        local_44 = local_44 + -1;
        ppVar2->physical_level = ppVar2->physical_level - 1;
        ppVar1 = *(prf_node_t **)
                  (*(long *)((long)pvVar5 + (long)local_44 * 8) +
                  (long)*(int *)((long)&ppVar6->model + (long)local_44 * 4) * 8);
        prf_nodeinfo_get((uint16_t)((ulong)local_20 >> 0x30));
        ppVar2->node = ppVar1;
        local_48 = (*in_RSI)(ppVar2,in_RDX);
        in_stack_ffffffffffffff80 = local_38;
        if (local_48 == 0) break;
        *(int *)((long)&ppVar6->model + (long)local_44 * 4) =
             *(int *)((long)&ppVar6->model + (long)local_44 * 4) + 1;
        in_stack_ffffffffffffff78 = local_20;
        in_stack_ffffffffffffff88 = local_40;
        local_40 = piVar4;
        local_38 = ppVar6;
        local_20 = pvVar5;
      }
    }
  }
  prf_state_destroy(in_stack_ffffffffffffff80);
  prf_array_free((void *)0x107526);
  prf_array_free((void *)0x107530);
  prf_array_free((void *)0x10753a);
  prf_array_free((void *)0x107544);
  return local_48;
}

Assistant:

int
prf_model_traverse_df( /* depth-first traversal */
    prf_model_t * model,
    prf_cb_t callback )
{
    prf_node_t *** stack, * node;
    prf_node_t ** array;
    int * child, * limit, level, traverse;
    prf_state_t * state;
    prf_nodeinfo_t * info;
    /* only losers recurse ;) */

    assert( model != NULL );
    assert( model->header != NULL );

    state = prf_state_create();
    state->model = model;
    stack = (prf_node_t ***)prf_array_init( 8, sizeof( prf_node_t ** ) );
    assert( stack != NULL );
    array = (prf_node_t **)prf_array_init( 1, sizeof( prf_node_t * ) );
    assert( array != NULL );
    array = (prf_node_t **)prf_array_append_ptr( array, model->header );
    stack = (prf_node_t ***)prf_array_append_ptr( stack, array );
    child = (int *)prf_array_init( 4, sizeof( int ) );
    assert( child != NULL );
    child = (int *)prf_array_append_int( child, 0 );
    limit = (int *)prf_array_init( 4, sizeof( int ) );
    assert( limit != NULL );
    limit = (int *)prf_array_append_int( limit, prf_array_count(stack[0]));
    traverse = PRF_TRAV_CONTINUE;

    level = 0;
    while ( child[0] < limit[0] ) {
        node = stack[level][child[level]];
        info = prf_nodeinfo_get( node->opcode );

        if ( (info != NULL) && (info->entry_f != NULL) )
            (*info->entry_f)(node, state);

        while ( node->children != NULL ) {
            stack = (prf_node_t ***)prf_array_append_ptr(stack,node->children);
            child = (int *)prf_array_append_int( child, 0 );
            limit = (int *)prf_array_append_int(limit, prf_array_count(stack[level+1]));
            prf_state_push( state );
            level++;
            state->physical_level++;
            node = stack[level][child[level]];
            info = prf_nodeinfo_get( node->opcode );
            if ( info->entry_f != NULL )
                (*info->entry_f)(node, state);
        }

        state->node = node;
        traverse = prf_cb_call( callback, state );

        if ( traverse == PRF_TRAV_EXIT )
            break;

        if ( traverse == PRF_TRAV_POP ) {
            prf_nodeinfo_t * info;
            info = prf_nodeinfo_get( stack[level][child[level]]->opcode );
            do {
                if ( info->exit_f != NULL )
                    (*(info->exit_f))( stack[level][child[level]], state );
                
                child[level]++;
                info = prf_nodeinfo_get( stack[level][child[level]]->opcode );
                if ( info->entry_f != NULL )
                    (*(info->entry_f))( stack[level][child[level]], state );
            } while ( (info->flags & PRF_POP_NODE) == 0 );
            continue;
        }

        child[level]++;

        if ( (level > 0) && (child[level] >= limit[level]) ) {
            stack = (prf_node_t ***)prf_array_set_count( stack, prf_array_count( stack ) - 1 );
            child = (int *)prf_array_set_count( child, prf_array_count( child ) - 1 );
            limit = (int *)prf_array_set_count( limit, prf_array_count( limit ) - 1 );
            prf_state_pop( state );
            level--;
            state->physical_level--;

            node = stack[level][child[level]];
            info = prf_nodeinfo_get( node->opcode );

            state->node = node;
            traverse = prf_cb_call( callback, state );

            if ( traverse == PRF_TRAV_EXIT )
                break;

            child[level]++;
        }
    }

    prf_state_destroy( state );
    prf_array_free( stack );
    prf_array_free( array );
    prf_array_free( child );
    prf_array_free( limit );
    return traverse;
}